

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uitercollationiterator.cpp
# Opt level: O0

UBool __thiscall
icu_63::FCDUIterCollationIterator::nextSegment
          (FCDUIterCollationIterator *this,UErrorCode *errorCode)

{
  int iVar1;
  UCharIterator *pUVar2;
  UCharIteratorMove *pUVar3;
  UBool UVar4;
  byte bVar5;
  uint16_t uVar6;
  int32_t iVar7;
  UChar32 UVar8;
  uint8_t leadCC;
  uint16_t fcd16;
  byte local_61;
  UChar32 c;
  uint8_t prevCC;
  UnicodeString s;
  UErrorCode *errorCode_local;
  FCDUIterCollationIterator *this_local;
  
  s.fUnion._48_8_ = errorCode;
  UVar4 = ::U_FAILURE(*errorCode);
  if (UVar4 != '\0') {
    return '\0';
  }
  iVar7 = (*((this->super_UIterCollationIterator).iter)->getIndex)
                    ((this->super_UIterCollationIterator).iter,UITER_CURRENT);
  this->pos = iVar7;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)&c);
  local_61 = 0;
  do {
    UVar8 = uiter_next32_63((this->super_UIterCollationIterator).iter);
    if (UVar8 < 0) break;
    uVar6 = Normalizer2Impl::getFCD16(this->nfcImpl,UVar8);
    bVar5 = (byte)(uVar6 >> 8);
    if ((bVar5 == 0) && (UVar4 = icu_63::UnicodeString::isEmpty((UnicodeString *)&c), UVar4 == '\0')
       ) {
      uiter_previous32_63((this->super_UIterCollationIterator).iter);
      break;
    }
    icu_63::UnicodeString::append((UnicodeString *)&c,UVar8);
    if ((bVar5 != 0) &&
       ((bVar5 < local_61 ||
        (UVar4 = CollationFCD::isFCD16OfTibetanCompositeVowel(uVar6), UVar4 != '\0'))))
    goto LAB_0029cec3;
    local_61 = (byte)uVar6;
  } while (local_61 != 0);
  iVar1 = this->pos;
  iVar7 = icu_63::UnicodeString::length((UnicodeString *)&c);
  this->limit = iVar1 + iVar7;
  pUVar2 = (this->super_UIterCollationIterator).iter;
  pUVar3 = pUVar2->move;
  iVar7 = icu_63::UnicodeString::length((UnicodeString *)&c);
  (*pUVar3)(pUVar2,-iVar7,UITER_CURRENT);
  this->state = ITER_IN_FCD_SEGMENT;
  this_local._7_1_ = '\x01';
LAB_0029d08b:
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)&c);
  return this_local._7_1_;
LAB_0029cec3:
  UVar8 = uiter_next32_63((this->super_UIterCollationIterator).iter);
  if (UVar8 < 0) goto LAB_0029cf3d;
  uVar6 = Normalizer2Impl::getFCD16(this->nfcImpl,UVar8);
  if (uVar6 < 0x100) {
    uiter_previous32_63((this->super_UIterCollationIterator).iter);
    goto LAB_0029cf3d;
  }
  icu_63::UnicodeString::append((UnicodeString *)&c,UVar8);
  goto LAB_0029cec3;
LAB_0029cf3d:
  UVar4 = normalize(this,(UnicodeString *)&c,(UErrorCode *)s.fUnion._48_8_);
  if (UVar4 == '\0') {
    this_local._7_1_ = '\0';
  }
  else {
    this->start = this->pos;
    iVar1 = this->pos;
    iVar7 = icu_63::UnicodeString::length((UnicodeString *)&c);
    this->limit = iVar1 + iVar7;
    this->state = IN_NORM_ITER_AT_LIMIT;
    this->pos = 0;
    this_local._7_1_ = '\x01';
  }
  goto LAB_0029d08b;
}

Assistant:

UBool
FCDUIterCollationIterator::nextSegment(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return FALSE; }
    U_ASSERT(state == ITER_CHECK_FWD);
    // The input text [start..(iter index)[ passes the FCD check.
    pos = iter.getIndex(&iter, UITER_CURRENT);
    // Collect the characters being checked, in case they need to be normalized.
    UnicodeString s;
    uint8_t prevCC = 0;
    for(;;) {
        // Fetch the next character and its fcd16 value.
        UChar32 c = uiter_next32(&iter);
        if(c < 0) { break; }
        uint16_t fcd16 = nfcImpl.getFCD16(c);
        uint8_t leadCC = (uint8_t)(fcd16 >> 8);
        if(leadCC == 0 && !s.isEmpty()) {
            // FCD boundary before this character.
            uiter_previous32(&iter);
            break;
        }
        s.append(c);
        if(leadCC != 0 && (prevCC > leadCC || CollationFCD::isFCD16OfTibetanCompositeVowel(fcd16))) {
            // Fails FCD check. Find the next FCD boundary and normalize.
            for(;;) {
                c = uiter_next32(&iter);
                if(c < 0) { break; }
                if(nfcImpl.getFCD16(c) <= 0xff) {
                    uiter_previous32(&iter);
                    break;
                }
                s.append(c);
            }
            if(!normalize(s, errorCode)) { return FALSE; }
            start = pos;
            limit = pos + s.length();
            state = IN_NORM_ITER_AT_LIMIT;
            pos = 0;
            return TRUE;
        }
        prevCC = (uint8_t)fcd16;
        if(prevCC == 0) {
            // FCD boundary after the last character.
            break;
        }
    }
    limit = pos + s.length();
    U_ASSERT(pos != limit);
    iter.move(&iter, -s.length(), UITER_CURRENT);
    state = ITER_IN_FCD_SEGMENT;
    return TRUE;
}